

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void cashew::ValueBuilder::appendCodeToSwitch(Ref switch_,Ref code,bool explicitBlock)

{
  char cVar1;
  uint uVar2;
  Ref *pRVar3;
  undefined8 *puVar4;
  Ref RVar5;
  int *piVar6;
  ulong uVar7;
  Value *local_38;
  Ref switch__local;
  Ref code_local;
  
  local_38 = switch_.inst;
  switch__local = code;
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_38);
  cVar1 = cashew::Ref::operator==(pRVar3,(IString *)&SWITCH);
  if (cVar1 == '\0') {
    __assert_fail("switch_[0] == SWITCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6f2,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
  }
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&switch__local);
  cVar1 = cashew::Ref::operator==(pRVar3,(IString *)&BLOCK);
  if (cVar1 != '\0') {
    if (explicitBlock) {
      puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      RVar5 = Value::back((Value *)*puVar4);
      RVar5 = Value::back(RVar5.inst);
      Value::push_back(RVar5.inst,switch__local);
      return;
    }
    puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&switch__local);
    piVar6 = (int *)*puVar4;
    if (*piVar6 == 2) {
      uVar7 = 0;
      do {
        if (*(ulong *)(*(long *)(piVar6 + 2) + 8) <= uVar7) {
          return;
        }
        puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
        RVar5 = Value::back((Value *)*puVar4);
        RVar5 = Value::back(RVar5.inst);
        uVar2 = cashew::Ref::operator[]((uint)&switch__local);
        puVar4 = (undefined8 *)cashew::Ref::operator[](uVar2);
        Value::push_back(RVar5.inst,(Value *)*puVar4);
        uVar7 = uVar7 + 1;
        puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&switch__local);
        piVar6 = (int *)*puVar4;
      } while (*piVar6 == 2);
    }
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x19a,"size_t cashew::Value::size()");
  }
  __assert_fail("code[0] == BLOCK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6f3,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
}

Assistant:

static void appendCodeToSwitch(Ref switch_, Ref code, bool explicitBlock) {
    assert(switch_[0] == SWITCH);
    assert(code[0] == BLOCK);
    if (!explicitBlock) {
      for (size_t i = 0; i < code[1]->size(); i++) {
        switch_[2]->back()->back()->push_back(code[1][i]);
      }
    } else {
      switch_[2]->back()->back()->push_back(code);
    }
  }